

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

void __thiscall spv::Builder::dump(Builder *this,Vector<unsigned_int> *out)

{
  uint *puVar1;
  Builder *pBVar2;
  pointer ppcVar3;
  iterator iVar4;
  Builder *pBVar5;
  _Rb_tree_header *p_Var6;
  long lVar7;
  Instruction memInst;
  Instruction sourceExtInst;
  undefined1 local_a0 [24];
  undefined1 local_88 [32];
  undefined1 local_68 [16];
  _Rb_tree_color local_58;
  undefined1 local_50 [16];
  _Base_ptr local_40;
  _Alloc_hider _Stack_38;
  
  iVar4._M_current =
       (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  puVar1 = (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (iVar4._M_current == puVar1) {
    pBVar5 = (Builder *)out;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)out,iVar4,
               &MagicNumber);
    iVar4._M_current =
         (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    puVar1 = (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar4._M_current = 0x7230203;
    iVar4._M_current = iVar4._M_current + 1;
    (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
    pBVar5 = this;
  }
  if (iVar4._M_current == puVar1) {
    pBVar5 = (Builder *)out;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)out,iVar4,
               &Version);
    iVar4._M_current =
         (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    puVar1 = (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar4._M_current = 0x10600;
    iVar4._M_current = iVar4._M_current + 1;
    (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_a0._0_4_ = this->builderNumber;
  if (iVar4._M_current == puVar1) {
    pBVar5 = (Builder *)out;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
    _M_realloc_insert<unsigned_int>(out,iVar4,(uint *)local_a0);
    iVar4._M_current =
         (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    puVar1 = (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar4._M_current = local_a0._0_4_;
    iVar4._M_current = iVar4._M_current + 1;
    (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_a0._0_4_ = this->uniqueId + 1;
  if (iVar4._M_current == puVar1) {
    pBVar5 = (Builder *)out;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
    _M_realloc_insert<unsigned_int>(out,iVar4,(uint *)local_a0);
    iVar4._M_current =
         (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    puVar1 = (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar4._M_current = local_a0._0_4_;
    iVar4._M_current = iVar4._M_current + 1;
    (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_a0._0_8_ = (ulong)(uint)local_a0._4_4_ << 0x20;
  if (iVar4._M_current == puVar1) {
    pBVar5 = (Builder *)out;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
    _M_realloc_insert<unsigned_int>(out,iVar4,(uint *)local_a0);
  }
  else {
    *iVar4._M_current = 0;
    (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  pBVar2 = (Builder *)(this->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(this->capabilities)._M_t._M_impl.super__Rb_tree_header;
  if (pBVar2 != (Builder *)p_Var6) {
    do {
      pBVar5 = pBVar2;
      local_a0._0_8_ = &PTR__Instruction_001f31e0;
      local_a0._8_4_ = SourceLanguageUnknown;
      local_a0._12_4_ = 0;
      local_a0._16_4_ = OpCapability;
      local_88._16_8_ = (pointer)0x0;
      local_88._24_8_ = (Block *)0x0;
      local_88._0_8_ = (pointer)0x0;
      local_88._8_8_ = (pointer)0x0;
      local_68._0_4_ = (int)(pBVar5->sourceText)._M_string_length;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)local_88,
                 (iterator)0x0,(uint *)local_68);
      Instruction::dump((Instruction *)local_a0,out);
      local_a0._0_8_ = &PTR__Instruction_001f31e0;
      std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                 local_88);
      pBVar2 = (Builder *)std::_Rb_tree_increment((_Rb_tree_node_base *)pBVar5);
    } while (pBVar2 != (Builder *)p_Var6);
  }
  pBVar2 = (Builder *)(this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(this->extensions)._M_t._M_impl.super__Rb_tree_header;
  if (pBVar2 != (Builder *)p_Var6) {
    do {
      pBVar5 = pBVar2;
      local_a0._0_8_ = &PTR__Instruction_001f31e0;
      local_a0._8_4_ = SourceLanguageUnknown;
      local_a0._12_4_ = 0;
      local_a0._16_4_ = OpExtension;
      local_88._16_8_ = (pointer)0x0;
      local_88._24_8_ = (Block *)0x0;
      local_88._0_8_ = (pointer)0x0;
      local_88._8_8_ = (pointer)0x0;
      Instruction::addStringOperand
                ((Instruction *)local_a0,(char *)(pBVar5->sourceText)._M_string_length);
      Instruction::dump((Instruction *)local_a0,out);
      local_a0._0_8_ = &PTR__Instruction_001f31e0;
      std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                 local_88);
      pBVar2 = (Builder *)std::_Rb_tree_increment((_Rb_tree_node_base *)pBVar5);
    } while (pBVar2 != (Builder *)p_Var6);
  }
  dumpInstructions(pBVar5,out,&this->imports);
  local_a0._0_8_ = &PTR__Instruction_001f31e0;
  local_a0._8_4_ = SourceLanguageUnknown;
  local_a0._12_4_ = 0;
  local_a0._16_4_ = OpMemoryModel;
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = (uint *)0x0;
  local_88._16_8_ = (uint *)0x0;
  local_88._24_8_ = (Block *)0x0;
  local_68._0_4_ = this->addressModel;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)local_88,
             (iterator)0x0,(uint *)local_68);
  local_68._0_4_ = this->memoryModel;
  if (local_88._8_8_ == local_88._16_8_) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)local_88,
               (iterator)local_88._8_8_,(uint *)local_68);
  }
  else {
    *(MemoryModel *)local_88._8_8_ = this->memoryModel;
    local_88._8_8_ = local_88._8_8_ + 4;
  }
  pBVar5 = (Builder *)local_a0;
  Instruction::dump((Instruction *)pBVar5,out);
  dumpInstructions(pBVar5,out,&this->entryPoints);
  dumpInstructions(pBVar5,out,&this->executionModes);
  dumpInstructions(pBVar5,out,&this->strings);
  dumpModuleProcesses(this,out);
  pBVar5 = this;
  dumpSourceInstructions(this,out);
  ppcVar3 = (this->sourceExtensions).
            super__Vector_base<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->sourceExtensions).
                              super__Vector_base<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar3) >> 3)) {
    lVar7 = 0;
    do {
      local_68._0_8_ = &PTR__Instruction_001f31e0;
      local_68._8_8_ = 0;
      local_58 = 4;
      local_40 = (_Base_ptr)0x0;
      _Stack_38._M_p = (pointer)0x0;
      local_50._0_8_ = (_Base_ptr)0x0;
      local_50._8_8_ = (_Base_ptr)0x0;
      Instruction::addStringOperand((Instruction *)local_68,ppcVar3[lVar7]);
      Instruction::dump((Instruction *)local_68,out);
      local_68._0_8_ = &PTR__Instruction_001f31e0;
      pBVar5 = (Builder *)local_50;
      std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                 local_50);
      lVar7 = lVar7 + 1;
      ppcVar3 = (this->sourceExtensions).
                super__Vector_base<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar7 < (int)((ulong)((long)(this->sourceExtensions).
                                         super__Vector_base<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar3)
                          >> 3));
  }
  dumpInstructions(pBVar5,out,&this->names);
  dumpInstructions(pBVar5,out,&this->lines);
  dumpInstructions(pBVar5,out,&this->decorations);
  dumpInstructions(pBVar5,out,&this->constantsTypesGlobals);
  dumpInstructions(pBVar5,out,&this->externals);
  Module::dump(&this->module,out);
  local_a0._0_8_ = &PTR__Instruction_001f31e0;
  std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_88);
  return;
}

Assistant:

void Builder::dump(dxil_spv::Vector<unsigned int>& out) const
{
    // Header, before first instructions:
    out.push_back(MagicNumber);
    out.push_back(Version);
    out.push_back(builderNumber);
    out.push_back(uniqueId + 1);
    out.push_back(0);

    // Capabilities
    for (auto it = capabilities.cbegin(); it != capabilities.cend(); ++it) {
        Instruction capInst(0, 0, OpCapability);
        capInst.addImmediateOperand(*it);
        capInst.dump(out);
    }

    for (auto it = extensions.cbegin(); it != extensions.cend(); ++it) {
        Instruction extInst(0, 0, OpExtension);
        extInst.addStringOperand(it->c_str());
        extInst.dump(out);
    }

    dumpInstructions(out, imports);
    Instruction memInst(0, 0, OpMemoryModel);
    memInst.addImmediateOperand(addressModel);
    memInst.addImmediateOperand(memoryModel);
    memInst.dump(out);

    // Instructions saved up while building:
    dumpInstructions(out, entryPoints);
    dumpInstructions(out, executionModes);

    // Debug instructions
    dumpInstructions(out, strings);
    dumpModuleProcesses(out);
    dumpSourceInstructions(out);
    for (int e = 0; e < (int)sourceExtensions.size(); ++e) {
        Instruction sourceExtInst(0, 0, OpSourceExtension);
        sourceExtInst.addStringOperand(sourceExtensions[e]);
        sourceExtInst.dump(out);
    }
    dumpInstructions(out, names);
    dumpInstructions(out, lines);

    // Annotation instructions
    dumpInstructions(out, decorations);

    dumpInstructions(out, constantsTypesGlobals);
    dumpInstructions(out, externals);

    // The functions
    module.dump(out);
}